

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSimpleBroadphase.cpp
# Opt level: O2

void __thiscall
cbtSimpleBroadphase::cbtSimpleBroadphase
          (cbtSimpleBroadphase *this,int maxProxies,cbtOverlappingPairCache *overlappingPairCache)

{
  undefined1 auVar1 [32];
  undefined8 uVar2;
  cbtHashedOverlappingPairCache *this_00;
  cbtSimpleBroadphaseProxy *pcVar3;
  cbtSimpleBroadphaseProxy *pcVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  size_t size;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  
  (this->super_cbtBroadphaseInterface)._vptr_cbtBroadphaseInterface =
       (_func_int **)&PTR__cbtSimpleBroadphase_01193350;
  this->m_pairCache = overlappingPairCache;
  this->m_ownsPairCache = false;
  this->m_invalidPair = 0;
  if (overlappingPairCache == (cbtOverlappingPairCache *)0x0) {
    this_00 = (cbtHashedOverlappingPairCache *)cbtAlignedAllocInternal(0x78,0x10);
    cbtHashedOverlappingPairCache::cbtHashedOverlappingPairCache(this_00);
    this->m_pairCache = (cbtOverlappingPairCache *)this_00;
    this->m_ownsPairCache = true;
  }
  size = (long)maxProxies * 0x38;
  pcVar3 = (cbtSimpleBroadphaseProxy *)cbtAlignedAllocInternal(size,0x10);
  this->m_pHandlesRawPtr = pcVar3;
  if (maxProxies != 0) {
    uVar6 = 0;
    auVar8 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar1 = vpmovsxwd_avx2(_DAT_00f5c400);
    auVar9 = vpbroadcastq_avx512f();
    pcVar4 = pcVar3;
    do {
      auVar10 = vpbroadcastq_avx512f();
      uVar6 = uVar6 + 8;
      auVar10 = vporq_avx512f(auVar10,auVar8);
      uVar2 = vpcmpuq_avx512f(auVar10,auVar9,2);
      vpscatterdq_avx512f(ZEXT864(pcVar4) + ZEXT3264(auVar1),uVar2,ZEXT1664((undefined1  [16])0x0));
      pcVar4 = pcVar4 + 8;
    } while (((size - 0x38) / 0x38 + 8 & 0xffffffffffffff8) != uVar6);
  }
  this->m_pHandles = pcVar3;
  this->m_maxHandles = maxProxies;
  this->m_numHandles = 0;
  this->m_firstFreeHandle = 0;
  this->m_LastHandleIndex = -1;
  iVar5 = 2;
  for (lVar7 = 0; (ulong)(uint)(~(maxProxies >> 0x1f) & maxProxies) * 0x38 - lVar7 != 0;
      lVar7 = lVar7 + 0x38) {
    *(int *)((long)(&(pcVar3->super_cbtBroadphaseProxy).m_aabbMax + 1) + lVar7) = iVar5 + -1;
    *(int *)((long)(pcVar3->super_cbtBroadphaseProxy).m_aabbMin.m_floats + lVar7 + -4) = iVar5;
    iVar5 = iVar5 + 1;
  }
  *(undefined4 *)&pcVar3[(long)maxProxies + -1].super_cbtBroadphaseProxy.field_0x34 = 0;
  return;
}

Assistant:

cbtSimpleBroadphase::cbtSimpleBroadphase(int maxProxies, cbtOverlappingPairCache* overlappingPairCache)
	: m_pairCache(overlappingPairCache),
	  m_ownsPairCache(false),
	  m_invalidPair(0)
{
	if (!overlappingPairCache)
	{
		void* mem = cbtAlignedAlloc(sizeof(cbtHashedOverlappingPairCache), 16);
		m_pairCache = new (mem) cbtHashedOverlappingPairCache();
		m_ownsPairCache = true;
	}

	// allocate handles buffer and put all handles on free list
	m_pHandlesRawPtr = cbtAlignedAlloc(sizeof(cbtSimpleBroadphaseProxy) * maxProxies, 16);
	m_pHandles = new (m_pHandlesRawPtr) cbtSimpleBroadphaseProxy[maxProxies];
	m_maxHandles = maxProxies;
	m_numHandles = 0;
	m_firstFreeHandle = 0;
	m_LastHandleIndex = -1;

	{
		for (int i = m_firstFreeHandle; i < maxProxies; i++)
		{
			m_pHandles[i].SetNextFree(i + 1);
			m_pHandles[i].m_uniqueId = i + 2;  //any UID will do, we just avoid too trivial values (0,1) for debugging purposes
		}
		m_pHandles[maxProxies - 1].SetNextFree(0);
	}
}